

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

void Gia_ManDupAppendShare(Gia_Man_t *pNew,Gia_Man_t *pTwo)

{
  uint uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Gia_Obj_t *pGVar9;
  long lVar10;
  long lVar11;
  
  if (pNew->vCis->nSize != pTwo->vCis->nSize) {
    __assert_fail("Gia_ManCiNum(pNew) == Gia_ManCiNum(pTwo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x3f1,"void Gia_ManDupAppendShare(Gia_Man_t *, Gia_Man_t *)");
  }
  if ((pNew->vHTable).nSize == 0) {
    Gia_ManHashStart(pNew);
  }
  pTwo->pObjs->Value = 0;
  if (1 < pTwo->nObjs) {
    lVar11 = 1;
    lVar10 = 0x14;
    do {
      pGVar3 = pTwo->pObjs;
      uVar4 = *(ulong *)((long)pGVar3 + lVar10 + -8);
      uVar6 = (uint)uVar4;
      iVar7 = (int)(uVar4 & 0x1fffffff);
      uVar2 = (uint)(uVar4 >> 0x20);
      if ((uVar4 & 0x1fffffff) == 0x1fffffff || (int)uVar6 < 0) {
        if ((~uVar6 & 0x9fffffff) == 0) {
          if (-1 < (int)uVar6) {
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          if (pNew->vCis->nSize <= (int)(uVar2 & 0x1fffffff)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar7 = pNew->vCis->pArray[uVar2 & 0x1fffffff];
          if (((long)iVar7 < 0) || (pNew->nObjs <= iVar7)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar5 = pNew->pObjs;
          pGVar9 = (Gia_Obj_t *)((ulong)(pGVar5 + iVar7) & 0xfffffffffffffffe);
          if ((pGVar9 < pGVar5) || (pGVar5 + pNew->nObjs <= pGVar9)) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar8 = (int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2);
          if (iVar8 * -0x55555555 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          iVar7 = ((uint)(pGVar5 + iVar7) & 1) + iVar8 * 0x55555556;
          goto LAB_001dd189;
        }
        if ((int)uVar6 < 0 && iVar7 != 0x1fffffff) {
          uVar2 = *(uint *)((long)pGVar3 + lVar10 + (ulong)(uint)(iVar7 << 2) * -3);
          if ((int)uVar2 < 0) goto LAB_001dd1b1;
          iVar7 = Gia_ManAppendCo(pNew,uVar2 ^ uVar6 >> 0x1d & 1);
          goto LAB_001dd189;
        }
      }
      else {
        uVar6 = *(uint *)((long)pGVar3 + lVar10 + (ulong)(uint)(iVar7 << 2) * -3);
        if (((int)uVar6 < 0) ||
           (uVar1 = *(uint *)((long)pGVar3 +
                             lVar10 + (ulong)((uint)(uVar4 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar1 < 0)) {
LAB_001dd1b1:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        iVar7 = Gia_ManHashAnd(pNew,uVar6 ^ (uint)(uVar4 >> 0x1d) & 1,uVar1 ^ uVar2 >> 0x1d & 1);
LAB_001dd189:
        *(int *)(&pGVar3->field_0x0 + lVar10) = iVar7;
      }
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0xc;
    } while (lVar11 < pTwo->nObjs);
  }
  return;
}

Assistant:

void Gia_ManDupAppendShare( Gia_Man_t * pNew, Gia_Man_t * pTwo )
{
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManCiNum(pNew) == Gia_ManCiNum(pTwo) );
    if ( Vec_IntSize(&pNew->vHTable) == 0 )
        Gia_ManHashStart( pNew );
    Gia_ManConst0(pTwo)->Value = 0;
    Gia_ManForEachObj1( pTwo, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_Obj2Lit( pNew, Gia_ManCi( pNew, Gia_ObjCioId(pObj) ) );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
}